

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O2

err_t dstuEcCreate(ec_o **pec,dstu_params *params,dstu_deep_i deep)

{
  size_t *p;
  ushort uVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ec_o *ec;
  err_t eVar9;
  ulong n;
  qr_o *f;
  void *stack;
  
  bVar2 = memIsValid(params,0x110);
  eVar9 = 0x1f6;
  if (bVar2 != 0) {
    uVar1 = params->p[0];
    if ((0xfea1 < (ushort)(uVar1 - 0x1fe)) && (params->A < 2)) {
      n = (ulong)(uVar1 + 0x3f >> 6);
      sVar3 = gf2Create_keep((ulong)uVar1);
      sVar4 = gf2Create_deep((ulong)uVar1);
      sVar5 = ec2CreateLD_keep(n);
      sVar6 = ec2CreateLD_deep(n,sVar4);
      sVar7 = ecCreateGroup_deep(sVar4);
      sVar8 = (*deep)(n,sVar4,3,sVar6);
      sVar4 = utilMax(4,sVar4 + 0x20,(uVar1 + 7 >> 3) + sVar6,sVar7,sVar8);
      ec = (ec_o *)blobCreate(sVar3 + sVar5 + sVar4);
      if (ec == (ec_o *)0x0) {
        eVar9 = 0x6e;
      }
      else {
        f = (qr_o *)((long)&(ec->hdr).keep + sVar5);
        p = (size_t *)((long)&(f->hdr).keep + sVar3);
        *(ulong *)((long)&(f->hdr).keep + sVar3) = (ulong)params->p[0];
        *(ulong *)((long)&(f->hdr).p_count + sVar3) = (ulong)params->p[1];
        *(ulong *)((long)&(f->hdr).o_count + sVar3) = (ulong)params->p[2];
        *(ulong *)((long)&f->mod + sVar3) = (ulong)params->p[3];
        bVar2 = gf2Create(f,p,(void *)((long)&f->unity + sVar3));
        if (bVar2 != 0) {
          *(octet *)p = params->A;
          memSet((void *)((long)p + 1),'\0',f->no - 1);
          stack = (void *)(f->no + (long)p);
          bVar2 = ec2CreateLD(ec,f,(octet *)p,params->B,stack);
          if ((bVar2 != 0) &&
             (sVar3 = ec->f->no,
             bVar2 = ecCreateGroup(ec,params->P,params->P + sVar3,params->n,sVar3,params->c,stack),
             bVar2 != 0)) {
            objAppend(ec,f,0);
            *pec = ec;
            return 0;
          }
        }
        blobClose(ec);
        eVar9 = 0x1f6;
      }
    }
  }
  return eVar9;
}

Assistant:

static err_t dstuEcCreate(
	ec_o** pec,						/* [out] описание эллиптической кривой */
	const dstu_params* params,		/* [in] долговременные параметры */
	dstu_deep_i deep				/* [in] потребности в стековой памяти */
)
{
	// размерности
	size_t m;
	size_t n;
	size_t f_keep;
	size_t f_deep;
	size_t ec_d;
	size_t ec_keep;
	size_t ec_deep;
	// состояние
	void* state;	
	size_t* p;			/* описание многочлена */
	qr_o* f;			/* поле */
	octet* A;			/* коэффициент A */
	ec_o* ec;			/* кривая */
	void* stack;
	// pre
	ASSERT(memIsValid(pec, sizeof(*pec)));
	// минимальная проверка входных данных
	if (!memIsValid(params, sizeof(dstu_params)) ||
		(m = params->p[0]) < 160 || m > 509 || 
		params->A > 1)
		return ERR_BAD_PARAMS;
	// определить размерности
	n = W_OF_B(m);
	f_keep = gf2Create_keep(m);
	f_deep = gf2Create_deep(m);
	ec_d = 3;
	ec_keep = ec2CreateLD_keep(n);
	ec_deep = ec2CreateLD_deep(n, f_deep);
	// создать состояние
	state = blobCreate(
		f_keep + ec_keep +
		utilMax(4,
			4 * sizeof(size_t) + f_deep,
			O_OF_B(m) + ec_deep,
			ecCreateGroup_deep(f_deep),
			deep(n, f_deep, ec_d, ec_deep)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	p = (size_t*)((octet*)f + f_keep);
	p[0] = params->p[0];
	p[1] = params->p[1];
	p[2] = params->p[2];
	p[3] = params->p[3];
	stack = p + 4;
	if (!gf2Create(f, p, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// создать кривую и группу
	ec = (ec_o*)state;
	A = (octet*)p;
	A[0] = params->A;
	memSetZero(A + 1, f->no - 1);
	stack = A + f->no;
	if (!ec2CreateLD(ec, f, A, params->B, stack) ||
		!ecCreateGroup(ec, params->P, params->P + ec->f->no, params->n, 
			ec->f->no, params->c, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	*pec = ec;
	return ERR_OK;
}